

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.h
# Opt level: O0

bool __thiscall Memory::MarkContext::IsEmpty(MarkContext *this)

{
  code *pcVar1;
  bool bVar2;
  PageAllocator *this_00;
  undefined8 *in_FS_OFFSET;
  MarkContext *this_local;
  
  bVar2 = HasPendingObjects(this);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = PagePool::IsEmpty(this->pagePool);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                         ,0x59,"(pagePool->IsEmpty())","pagePool->IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    this_00 = GetPageAllocator(this);
    bVar2 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::DisableAllocationOutOfMemory(this_00);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                         ,0x5a,"(!GetPageAllocator()->DisableAllocationOutOfMemory())",
                         "!GetPageAllocator()->DisableAllocationOutOfMemory()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IsEmpty()
    {
        if (HasPendingObjects())
        {
            return false;
        }

        Assert(pagePool->IsEmpty());
        Assert(!GetPageAllocator()->DisableAllocationOutOfMemory());
        return true;
    }